

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::inputevent(uint argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_val_t *pvVar2;
  vm_val_t *pvVar3;
  int32_t iVar4;
  int iVar5;
  vm_obj_id_t obj;
  int iVar6;
  size_t sVar7;
  os_event_info_t *poVar8;
  CVmConsoleMain *pCVar9;
  unsigned_long timeout;
  CVmObjPageEntry *this;
  ulong len;
  size_t sStackY_180;
  int evt;
  char c [4];
  vm_val_t val;
  char keyname [32];
  os_event_info_t info;
  
  iVar6 = 0;
  CVmBif::check_argc_range(argc,0,1);
  if (argc == 0) {
    timeout = 0;
  }
  else if (sp_[-1].typ == VM_NIL) {
    sp_ = sp_ + -1;
    timeout = 0;
    iVar6 = 0;
  }
  else {
    iVar4 = CVmBif::pop_long_val();
    timeout = (unsigned_long)iVar4;
    iVar6 = 1;
  }
  iVar5 = CVmConsole::read_event_script
                    (&G_console_X->super_CVmConsole,&evt,info.href,0x100,inputevent::filter,6,
                     (unsigned_long *)0x0);
  if (iVar5 == 0) {
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])();
      CVmConsole::reset_line_count(&G_console_X->super_CVmConsole,0);
      evt = os_get_event(timeout,iVar6,&info);
      goto LAB_00258841;
    }
    evt = 5;
LAB_00258855:
    sStackY_180 = 1;
  }
  else if (evt == 0x100) {
    info.key[0] = atoi(info.href);
    sStackY_180 = 2;
  }
  else {
LAB_00258841:
    sStackY_180 = 2;
    if (((evt != 1) && (evt != 3)) && (evt != 0x100)) goto LAB_00258855;
  }
  obj = CVmObjList::create(0,sStackY_180);
  this = G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff);
  CVmObjList::cons_clear((CVmObjList *)this);
  pvVar2 = sp_;
  aVar1._4_4_ = val.val._4_4_;
  aVar1.obj = obj;
  pvVar3 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(val._4_4_,5);
  sp_ = pvVar3;
  pvVar2->val = aVar1;
  val.typ = VM_INT;
  val.val.intval = evt;
  CVmObjList::cons_set_element((CVmObjList *)this,0,&val);
  if (evt == 0x100) {
    val.typ = VM_INT;
    val.val.obj = info.key[0];
    CVmObjList::cons_set_element((CVmObjList *)this,1,&val);
    poVar8 = (os_event_info_t *)keyname;
    sprintf(poVar8->href,"%d",(ulong)(uint)info.key[0]);
    pCVar9 = G_console_X;
    sVar7 = strlen(poVar8->href);
    iVar5 = 1;
    iVar6 = 0x100;
  }
  else {
    if (evt != 3) {
      if (evt != 1) {
        CVmConsole::log_event(&G_console_X->super_CVmConsole,evt);
        goto LAB_00258ab0;
      }
      if (iVar5 == 0) {
        if (info.key[0] == 0) {
          poVar8 = (os_event_info_t *)keyname;
          map_ext_key(poVar8->href,info.key[1]);
          sVar7 = strlen(poVar8->href);
          val.val.obj = CVmObjString::create(0,poVar8->href,sVar7);
          pCVar9 = G_console_X;
          val.typ = VM_OBJ;
          sVar7 = strlen(poVar8->href);
          iVar6 = 1;
          goto LAB_00258921;
        }
        c[0] = (char)info.key[0];
        len = 1;
        while (((iVar6 = (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[2])
                                   (G_cmap_from_ui_X,c,len), len < 4 && (iVar6 == 0)) &&
               (evt = os_get_event(0,0,&info), evt == 1))) {
          c[len] = info.href[0];
          len = len + 1;
        }
        map_raw_key(keyname,c,len);
        sVar7 = strlen(keyname);
        val.val.obj = CVmObjString::create(0,keyname,sVar7);
        pCVar9 = G_console_X;
        val.typ = VM_OBJ;
        sVar7 = strlen(keyname);
        CVmConsole::log_event(&pCVar9->super_CVmConsole,1,keyname,sVar7,1);
      }
      else {
        poVar8 = &info;
        val.val.obj = CVmBif::str_from_ui_str(poVar8->href);
        pCVar9 = G_console_X;
        val.typ = VM_OBJ;
        sVar7 = strlen(poVar8->href);
        iVar6 = 0;
LAB_00258921:
        CVmConsole::log_event(&pCVar9->super_CVmConsole,1,poVar8->href,sVar7,iVar6);
      }
      CVmObjList::cons_set_element((CVmObjList *)this,1,&val);
      goto LAB_00258ab0;
    }
    poVar8 = &info;
    val.val.obj = CVmBif::str_from_ui_str(poVar8->href);
    val.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this,1,&val);
    pCVar9 = G_console_X;
    sVar7 = strlen(poVar8->href);
    iVar6 = 3;
    iVar5 = 0;
  }
  CVmConsole::log_event(&pCVar9->super_CVmConsole,iVar6,poVar8->href,sVar7,iVar5);
LAB_00258ab0:
  CVmBif::retval_obj(obj);
  sp_ = sp_ + -1;
  return;
}

Assistant:

void CVmBifTIO::inputevent(VMG_ uint argc)
{
    int use_timeout;
    unsigned long timeout;
    os_event_info_t info;
    int evt;
    int ele_count;
    vm_obj_id_t lst_obj;
    CVmObjList *lst;
    char keyname[32];
    vm_val_t val;
    int from_script = FALSE;
    static const int filter[] =
    {
        OS_EVT_KEY, OS_EVT_TIMEOUT, OS_EVT_NOTIMEOUT,
        OS_EVT_HREF, OS_EVT_EOF, OS_EVT_COMMAND
    };

    /* check arguments */
    check_argc_range(vmg_ argc, 0, 1);

    /* if there's a timeout argument, get it */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (G_stk->get(0)->typ == VM_NIL)
    {
        /* the timeout is nil, which is the same as no timeout */
        use_timeout = FALSE;
        timeout = 0;

        /* discard the nil timeout value */
        G_stk->discard();
    }
    else
    {
        /* pop the timeout value */
        timeout = pop_long_val(vmg0_);

        /* note that we have a timeout to use */
        use_timeout = TRUE;
    }

    /* check for script input */
    if (G_console->read_event_script(
        vmg_ &evt, info.href, sizeof(info.href),
        filter, sizeof(filter)/sizeof(filter[0]), 0))
    {
        /* we got a script event - note it */
        from_script = TRUE;

        /* translate certain events */
        switch (evt)
        {
        case OS_EVT_COMMAND:
            /* read the numeric parameter */
            info.cmd_id = atoi(info.href);
            break;
        }
    }
    else if (G_net_config != 0)
    {
        /* there's no console in web host mode - return eof */
        evt = OS_EVT_EOF;
    }
    else
    {
        /* flush any buffered output */
        G_console->flush_all(vmg_ VM_NL_INPUT);

        /* reset the [MORE] counter */
        G_console->reset_line_count(FALSE);

        /* read an event from the OS layer */
        evt = os_get_event(timeout, use_timeout, &info);
    }

    /* figure out how big a list we need to allocate */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need two elements - one for the event type code, one for the
         *   keystroke string 
         */
        ele_count = 2;
        break;

    case OS_EVT_COMMAND:
        /* we need a second element for the command ID */
        ele_count = 2;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need two elements - one for the event type code, one for the
         *   HREF string 
         */
        ele_count = 2;
        break;

    default:
        /* for anything else, we need only the event type code element */
        ele_count = 1;
        break;
    }

    /* create the return list */
    lst_obj = CVmObjList::create(vmg_ FALSE, ele_count);
    lst = (CVmObjList *)vm_objp(vmg_ lst_obj);
    lst->cons_clear();

    /* save the list on the stack to protect against garbage collection */
    val.set_obj(lst_obj);
    G_stk->push(&val);

    /* fill in the first element with the event type code */
    val.set_int(evt);
    lst->cons_set_element(0, &val);

    /* set additional elements, according to the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* map the extended or ordinary key, as appropriate */
        if (from_script)
        {
            /* we got a key from the script - it's in the 'href' field */
            val.set_obj(str_from_ui_str(vmg_ info.href));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, info.href, strlen(info.href), FALSE);
        }
        else if (info.key[0] == 0)
        {
            /* it's an extended key */
            map_ext_key(vmg_ keyname, info.key[1]);

            /* create a string for the key name */
            val.set_obj(CVmObjString::create(
                vmg_ FALSE, keyname, strlen(keyname)));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, keyname, strlen(keyname), TRUE);
        }
        else
        {
            char c[4];
            size_t len;

            /* fetch more bytes until we have a complete character */
            for (c[0] = (char)info.key[0], len = 1 ;
                 !raw_key_complete(vmg_ c, len) && len < sizeof(c) ; )
            {
                /* 
                 *   Read another input event.  The keyboard driver should
                 *   already have queued up all of the bytes needed to
                 *   complete this character sequence, so there should never
                 *   be a delay from os_get_event() here - it should simply
                 *   return immediately with another OS_EVT_KEY event with
                 *   the next byte of the sequence.  
                 */
                evt = os_get_event(0, FALSE, &info);

                /* 
                 *   if it's not a keystroke event, something's wrong -
                 *   ignore the event and stop trying to read the remaining
                 *   bytes of the character sequence 
                 */
                if (evt != OS_EVT_KEY)
                    break;

                /* store the next byte of the sequence */
                c[len++] = (char)info.key[0];
            }

            /* it's an ordinary key - map it */
            map_raw_key(vmg_ keyname, c, len);

            /* create a string for the key name */
            val.set_obj(CVmObjString::create(
                vmg_ FALSE, keyname, strlen(keyname)));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, keyname, strlen(keyname), TRUE);
        }

        /* add it to the list */
        lst->cons_set_element(1, &val);

        break;

    case OS_EVT_HREF:
        /* create the string for the href text */
        val.set_obj(str_from_ui_str(vmg_ info.href));

        /* add it to the list */
        lst->cons_set_element(1, &val);

        /* log it */
        G_console->log_event(vmg_ OS_EVT_HREF,
                             info.href, strlen(info.href), FALSE);
        break;

    case OS_EVT_COMMAND:
        /* the second element is the command ID code */
        val.set_int(info.cmd_id);
        lst->cons_set_element(1, &val);

        /* log it */
        {
            char buf[20];
            sprintf(buf, "%d", info.cmd_id);
            G_console->log_event(vmg_ OS_EVT_COMMAND,
                                 buf, strlen(buf), TRUE);
        }
        break;

    default:
        /* other event types have no extra data */
        G_console->log_event(vmg_ evt);
        break;
    }

    /* return the list */
    retval_obj(vmg_ lst_obj);

    /* we can drop the garbage collection protection now */
    G_stk->discard();
}